

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

shared_ptr<duckdb::Pipeline,_true> __thiscall
duckdb::Executor::CreateChildPipeline(Executor *this,Pipeline *current,PhysicalOperator *op)

{
  pointer pLVar1;
  Pipeline *pPVar2;
  PhysicalOperator *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  pointer pLVar4;
  shared_ptr<duckdb::Pipeline,_true> sVar5;
  reference_wrapper<duckdb::PhysicalOperator> current_op;
  value_type local_30;
  
  make_shared_ptr<duckdb::Pipeline,duckdb::Executor&>(this);
  pPVar2 = shared_ptr<duckdb::Pipeline,_true>::operator->
                     ((shared_ptr<duckdb::Pipeline,_true> *)this);
  (pPVar2->sink).ptr = (PhysicalOperator *)op->estimated_cardinality;
  pPVar2 = shared_ptr<duckdb::Pipeline,_true>::operator->
                     ((shared_ptr<duckdb::Pipeline,_true> *)this);
  (pPVar2->source).ptr = in_RCX;
  pLVar1 = (op->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  _Var3._M_pi = extraout_RDX;
  for (pLVar4 = (op->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      (pLVar4 != pLVar1 &&
      (local_30._M_data = *(PhysicalOperator **)pLVar4, local_30._M_data != in_RCX));
      pLVar4 = (pointer)&pLVar4->type_info_) {
    pPVar2 = shared_ptr<duckdb::Pipeline,_true>::operator->
                       ((shared_ptr<duckdb::Pipeline,_true> *)this);
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    ::push_back(&(pPVar2->operators).
                 super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                ,&local_30);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar5.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::Pipeline,_true>)
         sVar5.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Pipeline> Executor::CreateChildPipeline(Pipeline &current, PhysicalOperator &op) {
	D_ASSERT(!current.operators.empty());
	D_ASSERT(op.IsSource());
	// found another operator that is a source, schedule a child pipeline
	// 'op' is the source, and the sink is the same
	auto child_pipeline = make_shared_ptr<Pipeline>(*this);
	child_pipeline->sink = current.sink;
	child_pipeline->source = &op;

	// the child pipeline has the same operators up until 'op'
	for (auto current_op : current.operators) {
		if (&current_op.get() == &op) {
			break;
		}
		child_pipeline->operators.push_back(current_op);
	}

	return child_pipeline;
}